

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

iterator __thiscall
cs::tree_type<cs::token_base*>::emplace_left_left<cs::token_base*&>
          (tree_type<cs::token_base_*> *this,iterator it,token_base **args)

{
  bool bVar1;
  error *this_00;
  tree_node *ptr;
  token_base **in_RDX;
  tree_node *in_RSI;
  tree_node *node;
  string *in_stack_ffffffffffffff88;
  allocator local_41;
  string local_40 [32];
  token_base **local_20;
  iterator local_10;
  iterator local_8;
  
  local_20 = in_RDX;
  local_10.mData = in_RSI;
  bVar1 = tree_type<cs::token_base_*>::iterator::usable(&local_10);
  if (!bVar1) {
    this_00 = (error *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"E000E",&local_41);
    cov::error::error(this_00,in_stack_ffffffffffffff88);
    __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
  }
  ptr = (tree_node *)operator_new(0x20);
  tree_node::tree_node<cs::token_base*&>
            ((tree_node *)ptr,local_10.mData,(local_10.mData)->left,(tree_node *)0x0,local_20);
  if ((local_10.mData)->left != (tree_node *)0x0) {
    (local_10.mData)->left->root = ptr;
  }
  (local_10.mData)->left = ptr;
  tree_type<cs::token_base_*>::iterator::iterator(&local_8,ptr);
  return (iterator)local_8.mData;
}

Assistant:

iterator emplace_left_left(iterator it, Args &&...args)
		{
			if (!it.usable())
				throw cov::error("E000E");
			tree_node *node = new tree_node(it.mData, it.mData->left, nullptr, std::forward<Args>(args)...);
			if (it.mData->left != nullptr)
				it.mData->left->root = node;
			it.mData->left = node;
			return node;
		}